

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O2

int Saig_ManReadNumber(Aig_Man_t *p,char *pToken)

{
  char cVar1;
  int iVar2;
  long lStack_8;
  
  cVar1 = *pToken;
  if (cVar1 != 'l') {
    if (cVar1 == 'n') {
      lStack_8 = 1;
      goto LAB_00519244;
    }
    if (cVar1 != 'p') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIoa.c"
                    ,0xb6,"int Saig_ManReadNumber(Aig_Man_t *, char *)");
    }
  }
  lStack_8 = 2;
LAB_00519244:
  iVar2 = atoi(pToken + lStack_8);
  return iVar2;
}

Assistant:

int Saig_ManReadNumber( Aig_Man_t * p, char * pToken )
{
    if ( pToken[0] == 'n' )
        return atoi( pToken + 1 );
    if ( pToken[0] == 'p' )
        return atoi( pToken + 2 );
    if ( pToken[0] == 'l' )
        return atoi( pToken + 2 );
    assert( 0 );
    return -1;
}